

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O0

Transform * __thiscall pbrt::TransformCache::Lookup(TransformCache *this,Transform *t)

{
  bool bVar1;
  Transform *pTVar2;
  size_type sVar3;
  reference ppTVar4;
  Transform *in_RDI;
  long *in_FS_OFFSET;
  Transform *tptr;
  local_iterator iter;
  size_t offset;
  Transform *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa1;
  _Node_iterator_base<pbrt::Transform_*,_true> local_50 [3];
  _Node_iterator_base<pbrt::Transform_*,_true> local_38 [3];
  ulong local_20;
  
  *(long *)(*in_FS_OFFSET + -0x6f0) = *(long *)(*in_FS_OFFSET + -0x6f0) + 1;
  bVar1 = std::
          unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
          ::empty((unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
                   *)0x43a9fb);
  if (!bVar1) {
    pTVar2 = (Transform *)Transform::Hash((Transform *)0x43aa0d);
    sVar3 = std::
            unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
            ::bucket_count((unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
                            *)0x43aa1f);
    local_20 = (ulong)pTVar2 % sVar3;
    std::
    unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
    ::begin((unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
             *)in_RDI,(size_type)pTVar2);
    while( true ) {
      std::
      unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
      ::end((unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
             *)in_RDI,(size_type)pTVar2);
      bVar1 = std::__detail::operator!=(local_38,local_50);
      if (!bVar1) break;
      std::__detail::
      _Local_iterator<pbrt::Transform_*,_pbrt::Transform_*,_std::__detail::_Identity,_pbrt::TransformHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true,_true>
      ::operator*((_Local_iterator<pbrt::Transform_*,_pbrt::Transform_*,_std::__detail::_Identity,_pbrt::TransformHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true,_true>
                   *)0x43aa7f);
      bVar1 = Transform::operator==(in_RDI,pTVar2);
      if (bVar1) {
        *(long *)(*in_FS_OFFSET + -0x6e8) = *(long *)(*in_FS_OFFSET + -0x6e8) + 1;
        ppTVar4 = std::__detail::
                  _Local_iterator<pbrt::Transform_*,_pbrt::Transform_*,_std::__detail::_Identity,_pbrt::TransformHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true,_true>
                  ::operator*((_Local_iterator<pbrt::Transform_*,_pbrt::Transform_*,_std::__detail::_Identity,_pbrt::TransformHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true,_true>
                               *)0x43aab6);
        return *ppTVar4;
      }
      std::__detail::
      _Local_iterator<pbrt::Transform_*,_pbrt::Transform_*,_std::__detail::_Identity,_pbrt::TransformHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true,_true>
      ::operator++((_Local_iterator<pbrt::Transform_*,_pbrt::Transform_*,_std::__detail::_Identity,_pbrt::TransformHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_true,_true>
                    *)in_RDI);
    }
  }
  pTVar2 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::Transform,pbrt::Transform_const&>
                     ((polymorphic_allocator<std::byte> *)
                      CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
                      in_stack_ffffffffffffff98);
  *(long *)(*in_FS_OFFSET + -0x6e0) = *(long *)(*in_FS_OFFSET + -0x6e0) + 0x80;
  std::
  unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
  ::insert((unordered_set<pbrt::Transform_*,_pbrt::TransformHash,_std::equal_to<pbrt::Transform_*>,_std::allocator<pbrt::Transform_*>_>
            *)CONCAT71(in_stack_ffffffffffffffa1,in_stack_ffffffffffffffa0),
           (value_type *)in_stack_ffffffffffffff98);
  return pTVar2;
}

Assistant:

const Transform *TransformCache::Lookup(const Transform &t) {
    ++nTransformCacheLookups;

    if (!hashTable.empty()) {
        size_t offset = t.Hash() % hashTable.bucket_count();
        for (auto iter = hashTable.begin(offset); iter != hashTable.end(offset); ++iter) {
            if (**iter == t) {
                ++nTransformCacheHits;
                return *iter;
            }
        }
    }
    Transform *tptr = alloc.new_object<Transform>(t);
    transformCacheBytes += sizeof(Transform);
    hashTable.insert(tptr);
    return tptr;
}